

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

RC __thiscall SM_Manager::SetUpPrint(SM_Manager *this,RelCatEntry *rEntry,DataAttrInfo *attributes)

{
  int iVar1;
  DataAttrInfo *pDVar2;
  int local_d8;
  int slot;
  int i;
  SM_AttrIterator attrIt;
  AttrCatEntry *aEntry;
  undefined1 local_50 [8];
  RM_Record attrRec;
  RID attrRID;
  RC rc;
  DataAttrInfo *attributes_local;
  RelCatEntry *rEntry_local;
  SM_Manager *this_local;
  
  RID::RID((RID *)&attrRec.field_0x14);
  RM_Record::RM_Record((RM_Record *)local_50);
  SM_AttrIterator::SM_AttrIterator((SM_AttrIterator *)&i);
  this_local._4_4_ =
       SM_AttrIterator::OpenIterator((SM_AttrIterator *)&i,&this->attrcatFH,rEntry->relName);
  if (this_local._4_4_ == 0) {
    for (local_d8 = 0; local_d8 < rEntry->attrCount; local_d8 = local_d8 + 1) {
      this_local._4_4_ =
           SM_AttrIterator::GetNextAttr
                     ((SM_AttrIterator *)&i,(RM_Record *)local_50,
                      (AttrCatEntry **)&attrIt.fs.useNextPage);
      if (this_local._4_4_ != 0) goto LAB_0010ed67;
      iVar1 = *(int *)(attrIt.fs._88_8_ + 0x44);
      pDVar2 = attributes + iVar1;
      *(undefined8 *)pDVar2->relName = *(undefined8 *)attrIt.fs._88_8_;
      *(undefined8 *)(pDVar2->relName + 8) = *(undefined8 *)(attrIt.fs._88_8_ + 8);
      *(undefined8 *)(pDVar2->relName + 0x10) = *(undefined8 *)(attrIt.fs._88_8_ + 0x10);
      pDVar2->relName[0x18] = *(char *)(attrIt.fs._88_8_ + 0x18);
      *(undefined8 *)attributes[iVar1].attrName = *(undefined8 *)(attrIt.fs._88_8_ + 0x19);
      *(undefined8 *)(attributes[iVar1].attrName + 8) = *(undefined8 *)(attrIt.fs._88_8_ + 0x21);
      *(undefined8 *)(attributes[iVar1].attrName + 0x10) = *(undefined8 *)(attrIt.fs._88_8_ + 0x29);
      attributes[iVar1].attrName[0x18] = *(char *)(attrIt.fs._88_8_ + 0x31);
      attributes[iVar1].offset = *(int *)(attrIt.fs._88_8_ + 0x34);
      attributes[iVar1].attrType = *(AttrType *)(attrIt.fs._88_8_ + 0x38);
      attributes[iVar1].attrLength = *(int *)(attrIt.fs._88_8_ + 0x3c);
      attributes[iVar1].indexNo = *(int *)(attrIt.fs._88_8_ + 0x40);
    }
    this_local._4_4_ = SM_AttrIterator::CloseIterator((SM_AttrIterator *)&i);
  }
LAB_0010ed67:
  SM_AttrIterator::~SM_AttrIterator((SM_AttrIterator *)&i);
  RM_Record::~RM_Record((RM_Record *)local_50);
  RID::~RID((RID *)&attrRec.field_0x14);
  return this_local._4_4_;
}

Assistant:

RC SM_Manager::SetUpPrint(RelCatEntry* rEntry, DataAttrInfo *attributes){
  RC rc = 0;
  RID attrRID;
  RM_Record attrRec;
  AttrCatEntry *aEntry;

  // Iterate through attrcat for attributes related to this relation
  SM_AttrIterator attrIt;
  if((rc = attrIt.OpenIterator(attrcatFH, rEntry->relName)))
    return (rc);

  for(int i=0; i < rEntry->attrCount; i++){
    if((rc = attrIt.GetNextAttr(attrRec, aEntry))){
      return (rc);
    }
    int slot = aEntry->attrNum; // insert its info in the appropriate slot

    memcpy(attributes[slot].relName, aEntry->relName, MAXNAME + 1);
    memcpy(attributes[slot].attrName, aEntry->attrName, MAXNAME + 1);
    attributes[slot].offset = aEntry->offset;
    attributes[slot].attrType = aEntry->attrType;
    attributes[slot].attrLength = aEntry->attrLength;
    attributes[slot].indexNo = aEntry->indexNo;
  }
  if((rc = attrIt.CloseIterator()))
    return (rc);

  return (rc);
}